

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedNodeMap.c
# Opt level: O3

IXML_Node_conflict * ixmlNamedNodeMap_getNamedItem(IXML_NamedNodeMap *nnMap,char *name)

{
  int iVar1;
  IXML_Node_conflict *pIVar2;
  long lVar3;
  
  if ((name != (char *)0x0 && nnMap != (IXML_NamedNodeMap *)0x0) &&
     (pIVar2 = nnMap->nodeItem, pIVar2 != (IXML_Node_conflict *)0x0)) {
    lVar3 = 0;
    do {
      iVar1 = strcmp(name,pIVar2->nodeName);
      if (iVar1 == 0) {
        if (lVar3 == -0x6b) {
          return (IXML_Node_conflict *)0x0;
        }
        pIVar2 = ixmlNamedNodeMap_item(nnMap,-lVar3);
        return pIVar2;
      }
      pIVar2 = pIVar2->nextSibling;
      lVar3 = lVar3 + -1;
    } while (pIVar2 != (Nodeptr)0x0);
  }
  return (IXML_Node_conflict *)0x0;
}

Assistant:

IXML_Node *ixmlNamedNodeMap_getNamedItem(
	IXML_NamedNodeMap *nnMap, const DOMString name)
{
	unsigned long index;

	if (nnMap == NULL || name == NULL) {
		return NULL;
	}

	index = ixmlNamedNodeMap_getItemNumber(nnMap, name);
	if (index == (unsigned long)IXML_INVALID_ITEM_NUMBER) {
		return NULL;
	} else {
		return ixmlNamedNodeMap_item(nnMap, index);
	}
}